

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O0

int __thiscall
highs::RbTree<HighsNodeQueue::NodeHybridEstimRbTree>::link
          (RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *this,char *__from,char *__to)

{
  int iVar1;
  LinkType x;
  LinkType y;
  tuple<double,_int,_long> *in_stack_ffffffffffffff98;
  tuple<double,_int,_long> *local_20;
  tuple<double,_int,_long> *local_18;
  
  local_18 = (tuple<double,_int,_long> *)0xffffffffffffffff;
  for (local_20 = (tuple<double,_int,_long> *)*this->rootNode;
      local_20 != (tuple<double,_int,_long> *)0xffffffffffffffff;
      local_20 = (tuple<double,_int,_long> *)
                 getChild((RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *)local_20,
                          (LinkType)in_stack_ffffffffffffff98,kLeft)) {
    local_18 = local_20;
    getKey(this,(LinkType)local_20);
    getKey(this,(LinkType)local_20);
    std::operator<(local_20,in_stack_ffffffffffffff98);
  }
  iVar1 = CacheMinRbTree<HighsNodeQueue::NodeHybridEstimRbTree>::link
                    ((CacheMinRbTree<HighsNodeQueue::NodeHybridEstimRbTree> *)this,__from,
                     (char *)local_18);
  return iVar1;
}

Assistant:

void link(LinkType z) {
    LinkType y = kNoLink;
    LinkType x = rootNode;
    while (x != kNoLink) {
      y = x;
      x = getChild(y, Dir(getKey(x) < getKey(z)));
    }

    static_cast<Impl*>(this)->link(z, y);
  }